

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_10f5107::HandleDifferentCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  char *__s;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  string_view value;
  allocator<char> local_92;
  allocator<char> local_91;
  cmExecutionStatus *local_90;
  string local_88;
  char *local_68;
  char *local_60;
  char *local_58;
  string local_50;
  
  iVar5 = 1;
  local_68 = (char *)0x0;
  local_60 = (char *)0x0;
  local_58 = (char *)0x0;
  uVar4 = 1;
  local_90 = status;
  do {
    __s = local_58;
    pcVar3 = local_60;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar4) {
      if (local_58 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"DIFFERENT not given result variable name.",
                   (allocator<char> *)&local_50);
        std::__cxx11::string::_M_assign((string *)&local_90->Error);
      }
      else {
        if ((local_68 != (char *)0x0) && (local_60 != (char *)0x0)) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,local_68,&local_91)
          ;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar3,&local_92);
          bVar2 = cmsys::SystemTools::FilesDiffer(&local_88,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_88);
          this = local_90->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,__s,(allocator<char> *)&local_50);
          pcVar3 = "0";
          if (bVar2) {
            pcVar3 = "1";
          }
          value._M_str = pcVar3;
          value._M_len = 1;
          cmMakefile::AddDefinition(this,&local_88,value);
          std::__cxx11::string::~string((string *)&local_88);
          return true;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"DIFFERENT not given FILES option with two file names.",
                   (allocator<char> *)&local_50);
        std::__cxx11::string::_M_assign((string *)&local_90->Error);
      }
LAB_0039b297:
      std::__cxx11::string::~string((string *)&local_88);
      return false;
    }
    bVar2 = std::operator==(pbVar1 + uVar4,"FILES");
    if (bVar2) {
      iVar5 = 2;
    }
    else {
      if (iVar5 == 3) {
        local_60 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p;
      }
      else {
        if (iVar5 == 2) {
          local_68 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p;
          iVar5 = 3;
          goto LAB_0039b152;
        }
        if (iVar5 != 1) {
          cmStrCat<char_const(&)[34],std::__cxx11::string_const&>
                    (&local_88,(char (*) [34])"DIFFERENT given unknown argument ",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar4);
          std::__cxx11::string::_M_assign((string *)&local_90->Error);
          goto LAB_0039b297;
        }
        local_58 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p;
      }
      iVar5 = 0;
    }
LAB_0039b152:
    uVar4 = (ulong)((int)uVar4 + 1);
  } while( true );
}

Assistant:

bool HandleDifferentCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  /*
    FILE(DIFFERENT <variable> FILES <lhs> <rhs>)
   */

  // Evaluate arguments.
  const char* file_lhs = nullptr;
  const char* file_rhs = nullptr;
  const char* var = nullptr;
  enum Doing
  {
    DoingNone,
    DoingVar,
    DoingFileLHS,
    DoingFileRHS
  };
  Doing doing = DoingVar;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILES") {
      doing = DoingFileLHS;
    } else if (doing == DoingVar) {
      var = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingFileLHS) {
      file_lhs = args[i].c_str();
      doing = DoingFileRHS;
    } else if (doing == DoingFileRHS) {
      file_rhs = args[i].c_str();
      doing = DoingNone;
    } else {
      status.SetError(cmStrCat("DIFFERENT given unknown argument ", args[i]));
      return false;
    }
  }
  if (!var) {
    status.SetError("DIFFERENT not given result variable name.");
    return false;
  }
  if (!file_lhs || !file_rhs) {
    status.SetError("DIFFERENT not given FILES option with two file names.");
    return false;
  }

  // Compare the files.
  const char* result =
    cmSystemTools::FilesDiffer(file_lhs, file_rhs) ? "1" : "0";
  status.GetMakefile().AddDefinition(var, result);
  return true;
}